

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenCard.cpp
# Opt level: O3

void __thiscall GreenCard::GreenCard(GreenCard *this,string *n,int t)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + n->_M_string_length)
  ;
  Card::Card(&this->super_Card,&local_50,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_Card)._vptr_Card = (_func_int **)&PTR_effectBonus_00118168;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->type = t;
  this->tapped = false;
  return;
}

Assistant:

GreenCard::GreenCard(string n, int t) : Card{n, t}
{
    name = n;
    type = Type(t);

    tapped = false;
}